

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_reader.h
# Opt level: O2

void __thiscall xray_re::xr_ogf_v4::load_vcontainer(xr_ogf_v4 *this,xr_reader *r)

{
  uint32_t *puVar1;
  
  puVar1 = (r->field_2).m_p_u32;
  (r->field_2).m_p = (uint8_t *)(puVar1 + 1);
  this->m_ext_vb_index = *puVar1;
  puVar1 = (r->field_2).m_p_u32;
  (r->field_2).m_p = (uint8_t *)(puVar1 + 1);
  this->m_ext_vb_offset = *puVar1;
  puVar1 = (r->field_2).m_p_u32;
  (r->field_2).m_p = (uint8_t *)(puVar1 + 1);
  this->m_ext_vb_size = *puVar1;
  puVar1 = &(this->super_xr_ogf).m_loaded;
  *(byte *)puVar1 = (byte)*puVar1 | 0x80;
  return;
}

Assistant:

inline uint32_t xr_reader::r_u32() { return *m_p_u32++; }